

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_11b465a::looksLikeSpecialVariable
          (anon_unknown_dwarf_11b465a *this,string *var,static_string_view prefix,size_t varNameLen)

{
  string_view view;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  bool local_fd;
  cmAlphaNum local_e8;
  string *local_b8;
  size_t sStack_b0;
  cmAlphaNum local_a0;
  string local_70;
  string_view local_50;
  string_view local_40;
  char *local_30;
  size_t varNameLen_local;
  string *var_local;
  static_string_view prefix_local;
  
  local_30 = prefix.super_string_view._M_str;
  prefix_local.super_string_view._M_len = prefix.super_string_view._M_len;
  varNameLen_local = (size_t)this;
  var_local = var;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&var_local);
  bVar1 = false;
  local_fd = false;
  if ((char *)(sVar3 + 3) <= local_30) {
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)varNameLen_local);
    local_b8 = var_local;
    sStack_b0 = prefix_local.super_string_view._M_len;
    view._M_str = (char *)prefix_local.super_string_view._M_len;
    view._M_len = (size_t)var_local;
    cmAlphaNum::cmAlphaNum(&local_a0,view);
    cmAlphaNum::cmAlphaNum(&local_e8,'{');
    cmStrCat<>(&local_70,&local_a0,&local_e8);
    bVar1 = true;
    local_50 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
    bVar2 = cmHasPrefix(local_40,local_50);
    local_fd = false;
    if (bVar2) {
      pcVar4 = (char *)std::__cxx11::string::operator[](varNameLen_local);
      local_fd = *pcVar4 == '}';
    }
  }
  prefix_local.super_string_view._M_str._7_1_ = local_fd;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  return (bool)(prefix_local.super_string_view._M_str._7_1_ & 1);
}

Assistant:

bool looksLikeSpecialVariable(const std::string& var,
                              cm::static_string_view prefix,
                              const std::size_t varNameLen)
{
  // NOTE Expecting a variable name at least 1 char length:
  // <prefix> + `{` + <varname> + `}`
  return ((prefix.size() + 3) <= varNameLen) &&
    cmHasPrefix(var, cmStrCat(prefix, '{')) && var[varNameLen - 1] == '}';
}